

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O0

void __thiscall
UInt128_PostIncrement_Test::~UInt128_PostIncrement_Test(UInt128_PostIncrement_Test *this)

{
  UInt128_PostIncrement_Test *this_local;
  
  ~UInt128_PostIncrement_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (UInt128, PostIncrement) {
    {
        pstore::uint128 a{0U};
        pstore::uint128 ra = a++;
        EXPECT_EQ (ra, pstore::uint128{});
        EXPECT_EQ (a, pstore::uint128{1U});
    }
    {
        pstore::uint128 b{max64};
        pstore::uint128 rb = b++;
        EXPECT_EQ (rb, pstore::uint128 (max64));
        EXPECT_EQ (b, pstore::uint128 (1U, 0U));
    }
    {
        pstore::uint128 c{max64, max64};
        pstore::uint128 rc = c++;
        EXPECT_EQ (rc, pstore::uint128 (max64, max64));
        EXPECT_EQ (c, (pstore::uint128{}));
    }
}